

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_bin
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char cVar1;
  basic_format_specs<char> *specs;
  bool bVar2;
  buffer_appender<char> bVar3;
  uint uVar4;
  int num_digits;
  string_view prefix;
  anon_class_48_3_ff6d91eb local_78;
  undefined1 auStack_48 [8];
  write_int_data<char> data;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = '0';
    cVar1 = specs->type;
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = cVar1;
  }
  num_digits = 0;
  uVar4 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar2 = 1 < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar2);
  data.padding = (size_t)(this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                         container;
  uVar4 = this->prefix_size;
  prefix.size_._0_4_ = uVar4;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data((write_int_data<char> *)auStack_48,num_digits,prefix,specs);
  local_78.data.size = (size_t)auStack_48;
  local_78.data.padding = data.size;
  local_78.prefix.data_ = this->prefix;
  local_78.prefix.size_ = (ulong)uVar4;
  local_78.f.this =
       (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *)this;
  local_78.f.num_digits = num_digits;
  bVar3 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_int>::on_bin()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>(fmt::v7::detail::buffer_appender<char>,int,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_int>::on_bin()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    ((buffer_appender<char>)data.padding,specs,(size_t)auStack_48,(size_t)auStack_48
                     ,&local_78);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

void on_bin() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = static_cast<char>(specs.type);
    }
    int num_digits = count_digits<1>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<1, Char>(it, abs_value, num_digits);
                    });
  }